

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O1

int formula(char *expr,rpf_t **rpf,variables_t *variable)

{
  ulong uVar1;
  rpf_type_t rVar2;
  ushort *puVar3;
  char *__s1;
  void *pvVar4;
  operation_t *poVar5;
  int iVar6;
  ushort **ppuVar7;
  size_t sVar8;
  double *pdVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  void *pvVar13;
  rpf_type_t *prVar14;
  rpf_t *prVar15;
  rpf_t *prVar16;
  byte bVar17;
  long lVar18;
  operation_t *poVar19;
  rpf_type_t *prVar20;
  byte *pbVar21;
  int in_R8D;
  byte *pbVar22;
  byte *pbVar23;
  operation_t *__s;
  uint uVar24;
  variables_t *pvVar25;
  bool bVar26;
  double dVar27;
  int sp_op;
  rpf_t rpf_start;
  stack_t num [256];
  stack_t op [256];
  int local_2170;
  uint local_216c;
  byte *local_2168;
  ushort **local_2160;
  variables_t *local_2158;
  long local_2150;
  rpf_t **local_2148;
  variables_t *local_2140;
  rpf_t local_2138 [10];
  stack_t local_2038 [255];
  stack_t local_1048;
  stack_t local_1038 [256];
  
  *rpf = (rpf_t *)0x0;
  pbVar23 = (byte *)0x0;
  local_2170 = 0;
  local_216c = 0;
  local_2140 = variable + 1;
  local_2158 = variable;
  local_2148 = rpf;
LAB_00102797:
  bVar17 = *expr;
  if (0x28 < bVar17) {
    if (bVar17 == 0x2c) {
      prVar15 = formula_output(local_2038,&local_2170,local_1038,(int *)&local_216c,in_R8D);
      pbVar21 = (byte *)0x0;
      if (prVar15 == (rpf_t *)0x0) {
        return 0;
      }
      goto LAB_00102cf2;
    }
    if (bVar17 == 0x29) {
LAB_00102ea7:
      prVar15 = formula_output(local_2038,&local_2170,local_1038,(int *)&local_216c,in_R8D);
      if (prVar15 == (rpf_t *)0x0) {
        return 0;
      }
      if (-1 < local_2170) {
        if (local_216c == 0) {
          local_2138[0].type = TYPE_START;
          if (0 < local_2170) {
            uVar10 = (ulong)(local_2170 - 1);
            prVar15 = local_2138;
            do {
              rVar2 = local_2038[uVar10].type;
              if (rVar2 == TYPE_RPF) {
                prVar15->next = (rpf_t *)local_2038[uVar10].value;
                do {
                  prVar16 = prVar15;
                  prVar15 = prVar16->next;
                } while (prVar16->next != (rpf_t *)0x0);
              }
              else {
                prVar16 = (rpf_t *)malloc(0x18);
                prVar15->next = prVar16;
                prVar16->type = rVar2;
                prVar16->value = local_2038[uVar10].value;
                prVar16->next = (rpf_t *)0x0;
              }
              bVar26 = 0 < (long)uVar10;
              uVar10 = uVar10 - 1;
              prVar15 = prVar16;
            } while (bVar26);
          }
          *local_2148 = local_2138[0].next;
          return 1;
        }
        return 0;
      }
      return 0;
    }
LAB_001028a3:
    ppuVar7 = __ctype_b_loc();
    pbVar21 = (byte *)0x0;
    if ((*(byte *)((long)*ppuVar7 + (long)(char)bVar17 * 2 + 1) & 0x20) != 0) goto LAB_00102cf2;
    poVar19 = operation;
    local_2168 = pbVar23;
    if (operation[0].type != TYPE_MAX) {
      __s = operation;
LAB_001028da:
      sVar8 = strlen(__s->op);
      iVar6 = strncmp(expr,__s->op,sVar8);
      if (iVar6 != 0) goto code_r0x001028f8;
      if (0 < (long)(int)local_216c) {
        uVar24 = local_216c - 1;
        if (local_1038[uVar24].rank == __s->rank) {
          local_2138[0].type = TYPE_MATH;
          prVar15 = formula_output(local_2038,&local_2170,&local_1048 + (int)local_216c,
                                   (int *)local_2138,in_R8D);
          local_216c = uVar24;
        }
        else {
          if (((int)local_216c < 1) || (local_1038[local_216c - 1].rank <= __s->rank))
          goto LAB_00102aed;
          prVar15 = formula_output(local_2038,&local_2170,local_1038,(int *)&local_216c,in_R8D);
        }
        if (prVar15 == (rpf_t *)0x0) {
          operation[0xb].rank = (int)operation[0xb]._8_8_;
          operation[0xb].type = SUB84(operation[0xb]._8_8_,4);
          return 0;
        }
      }
LAB_00102aed:
      prVar20 = &__s->type;
      sVar8 = strlen(__s->op);
      iVar6 = local_2170;
      pbVar23 = (byte *)expr + sVar8;
      pbVar21 = (byte *)expr + sVar8;
      do {
        pbVar22 = pbVar21;
        pbVar23 = pbVar23 + 1;
        pbVar21 = pbVar22 + 1;
      } while ((*(byte *)((long)*ppuVar7 + (long)(char)*pbVar22 * 2 + 1) & 0x20) != 0);
      local_2160 = ppuVar7;
      if ((local_2170 == 0) && (__s->func == math_sub)) {
        local_2038[0].rank = 0;
        local_2038[0].type = TYPE_VALUE;
        local_2038[0].value = malloc(8);
        *(undefined8 *)local_2038[0].value = 0xbff0000000000000;
        local_2170 = 1;
        local_1038[(int)local_216c].rank = operation[0xb].rank;
        local_1038[(int)local_216c].type = operation[0xb].type;
        local_1038[(int)local_216c].value = (void *)0x106270;
LAB_00102d73:
        local_216c = local_216c + 1;
        pbVar21 = (byte *)0x0;
        expr = (char *)(pbVar22 + -1);
        ppuVar7 = local_2160;
        goto LAB_00102911;
      }
      if (((int)local_2168 == 1) && (*prVar20 != TYPE_MATH)) {
        if (__s->func != math_sub) {
          return 0;
        }
        lVar18 = (long)local_2170;
        local_2038[lVar18].rank = 0;
        local_2038[lVar18].type = TYPE_VALUE;
        puVar11 = (undefined8 *)malloc(8);
        local_2038[lVar18].value = puVar11;
        *puVar11 = 0xbff0000000000000;
        local_2170 = iVar6 + 1;
        local_1038[(int)local_216c].rank = operation[0xb].rank;
        local_1038[(int)local_216c].type = operation[0xb].type;
        local_1038[(int)local_216c].value = (void *)0x106270;
        goto LAB_00102d73;
      }
      pbVar21 = (byte *)0x1;
      if (*prVar20 == TYPE_MATH) {
        lVar18 = (long)(int)local_216c;
        local_216c = local_216c + 1;
        local_1038[lVar18].rank = __s->rank;
        local_1038[lVar18].type = TYPE_MATH;
        local_1038[lVar18].value = __s;
        if (0 < __s->narg) {
          iVar6 = 0;
          do {
            bVar17 = pbVar23[-1];
            if (bVar17 != 0x28) {
              if (bVar17 != 0) goto LAB_00102ba9;
              goto LAB_00102d82;
            }
            iVar6 = iVar6 + 1;
LAB_00102ba9:
            iVar6 = iVar6 - (uint)(bVar17 == 0x29);
            if (iVar6 == 0) goto LAB_00102d80;
            pbVar23 = pbVar23 + 1;
          } while( true );
        }
        pbVar21 = (byte *)0x0;
      }
      goto LAB_00102e6d;
    }
LAB_00102906:
    prVar20 = &poVar19->type;
    pbVar21 = (byte *)((ulong)local_2168 & 0xffffffff);
    goto LAB_00102911;
  }
  if (bVar17 != 0x28) {
    if (bVar17 == 0) goto LAB_00102ea7;
    goto LAB_001028a3;
  }
  ppuVar7 = __ctype_b_loc();
  do {
    pbVar21 = (byte *)expr;
    expr = (char *)(pbVar21 + 1);
  } while ((*(byte *)((long)*ppuVar7 + (long)(char)*pbVar21 * 2 + 1) & 0x20) != 0);
  iVar6 = 0;
  pbVar22 = pbVar21;
  while( true ) {
    bVar17 = *pbVar22;
    if (bVar17 == 0x28) {
      iVar6 = iVar6 + 1;
    }
    else if (bVar17 == 0) goto LAB_00102827;
    iVar6 = iVar6 - (uint)(bVar17 == 0x29);
    if (iVar6 == 0) break;
    pbVar22 = pbVar22 + 1;
  }
  iVar6 = 0;
LAB_00102827:
  expr = (char *)pbVar21;
  if ((bVar17 == 0) || (iVar6 != 0)) {
    bVar26 = false;
  }
  else {
    iVar6 = formula((char *)(pbVar21 + 1),(rpf_t **)local_2138,local_2158);
    bVar26 = false;
    if (iVar6 != 0) {
      bVar26 = true;
      if ((void *)CONCAT44(local_2138[0]._4_4_,local_2138[0].type) != (void *)0x0) {
        lVar18 = (long)local_2170;
        local_2170 = local_2170 + 1;
        local_2038[lVar18].rank = 0;
        local_2038[lVar18].type = TYPE_RPF;
        local_2038[lVar18].value = (void *)CONCAT44(local_2138[0]._4_4_,local_2138[0].type);
      }
      pbVar23 = (byte *)0x0;
      expr = (char *)pbVar22;
    }
  }
  pbVar21 = pbVar23;
  if (!bVar26) {
    return 0;
  }
  goto LAB_00102cf2;
code_r0x001028f8:
  poVar19 = __s + 1;
  poVar5 = __s + 1;
  __s = poVar19;
  if (poVar5->type == TYPE_MAX) goto LAB_00102906;
  goto LAB_001028da;
LAB_00102d80:
  iVar6 = 0;
LAB_00102d82:
  if ((bVar17 == 0) || (iVar6 != 0)) {
    bVar26 = false;
    pbVar23 = pbVar22;
  }
  else {
    iVar6 = formula((char *)(pbVar22 + 1),(rpf_t **)local_2138,local_2158);
    pvVar4 = (void *)CONCAT44(local_2138[0]._4_4_,local_2138[0].type);
    if (pvVar4 == (void *)0x0 || iVar6 == 0) {
      bVar26 = false;
      pbVar23 = pbVar22;
    }
    else {
      local_2168 = (byte *)(long)local_2170;
      local_2038[(long)local_2168].rank = 0;
      local_2038[(long)local_2168].type = TYPE_RPF;
      local_2038[(long)local_2168].value = pvVar4;
      do {
        pvVar13 = pvVar4;
        pvVar4 = *(void **)((long)pvVar13 + 0x10);
      } while (pvVar4 != (void *)0x0);
      lVar18 = (long)(int)local_216c + -1;
      local_2150 = lVar18;
      prVar14 = (rpf_type_t *)malloc(0x18);
      *(rpf_type_t **)((long)pvVar13 + 0x10) = prVar14;
      *prVar14 = local_1038[lVar18].type;
      *(void **)(prVar14 + 2) = local_1038[lVar18].value;
      prVar14[4] = TYPE_VALUE;
      prVar14[5] = TYPE_VALUE;
      local_216c = (uint)local_2150;
      local_2170 = (int)local_2168 + 1;
      bVar26 = true;
    }
  }
  pbVar21 = (byte *)0x0;
  pbVar22 = pbVar23;
  if (!bVar26) {
    return 0;
  }
LAB_00102e6d:
  rVar2 = *prVar20;
  if (rVar2 != TYPE_MATH) {
    lVar18 = (long)(int)local_216c;
    local_216c = local_216c + 1;
    local_1038[lVar18].rank = __s->rank;
    local_1038[lVar18].type = rVar2;
    local_1038[lVar18].value = __s;
  }
  expr = (char *)(pbVar22 + -1);
  ppuVar7 = local_2160;
LAB_00102911:
  iVar6 = local_2170;
  if (*prVar20 == TYPE_MAX) {
    puVar3 = *ppuVar7;
    if ((*(byte *)((long)puVar3 + (long)*expr * 2 + 1) & 4) == 0) {
      bVar17 = *expr;
      pbVar23 = (byte *)expr;
      if (bVar17 != 0) {
        lVar18 = 0;
        do {
          if ((*(byte *)((long)puVar3 + (long)(char)bVar17 * 2 + 1) & 8) == 0) {
            if ((bVar17 != 0x2e) && (lVar18 != 0 || bVar17 != 0x2d)) break;
          }
          bVar17 = ((byte *)expr)[lVar18 + 1];
          lVar18 = lVar18 + 1;
        } while (bVar17 != 0);
        pbVar23 = (byte *)expr + lVar18;
      }
      lVar18 = (long)local_2170;
      local_2038[lVar18].rank = 0;
      local_2038[lVar18].type = TYPE_VALUE;
      pdVar9 = (double *)malloc(8);
      local_2038[lVar18].value = pdVar9;
      dVar27 = strtod(expr,(char **)0x0);
      *pdVar9 = dVar27;
      local_2170 = iVar6 + 1;
      expr = (char *)(pbVar23 + -1);
      pbVar21 = (byte *)0x0;
    }
    else {
      if (local_2158 == (variables_t *)0x0) {
        bVar26 = false;
      }
      else {
        bVar17 = *expr;
        if (bVar17 == 0) {
          uVar10 = 0;
          pbVar23 = (byte *)expr;
        }
        else {
          uVar10 = 0;
          do {
            if (((puVar3[(char)bVar17] & 8) == 0) &&
               ((uVar1 = uVar10, 4 < bVar17 - 0x5b || ((0x15U >> (bVar17 - 0x5b & 0x1f) & 1) == 0)))
               ) goto LAB_00102a9f;
            uVar1 = uVar10 + 1;
            *(byte *)((long)&local_2138[0].type + uVar10) = bVar17;
            bVar17 = ((byte *)expr)[uVar10 + 1];
            uVar10 = uVar1;
          } while (bVar17 != 0);
          uVar10 = uVar1 & 0xffffffff;
LAB_00102a9f:
          uVar10 = uVar10 & 0xffffffff;
          pbVar23 = (byte *)expr + uVar1;
        }
        *(undefined1 *)((long)&local_2138[0].type + uVar10) = 0;
        bVar26 = local_2158->name != (char *)0x0;
        if (bVar26) {
          local_2168 = pbVar23;
          iVar6 = strcmp(local_2158->name,(char *)local_2138);
          if (iVar6 == 0) {
            lVar18 = 0;
          }
          else {
            lVar18 = 0;
            pvVar25 = local_2140;
            do {
              __s1 = pvVar25->name;
              bVar26 = __s1 != (char *)0x0;
              pbVar23 = local_2168;
              if (__s1 == (char *)0x0) goto LAB_00102cda;
              iVar6 = strcmp(__s1,(char *)local_2138);
              pvVar25 = pvVar25 + 1;
              lVar18 = lVar18 + 1;
            } while (iVar6 != 0);
          }
          lVar12 = (long)local_2170;
          local_2170 = local_2170 + 1;
          local_2038[lVar12].rank = 0;
          local_2038[lVar12].type = TYPE_VARIABLE;
          local_2038[lVar12].value = local_2158[lVar18].pointer;
          pbVar23 = local_2168;
        }
LAB_00102cda:
        if (bVar26) {
          expr = (char *)(pbVar23 + -1);
        }
      }
      pbVar21 = (byte *)0x0;
      if (!bVar26) {
        return 0;
      }
    }
  }
LAB_00102cf2:
  pbVar23 = pbVar21;
  expr = (char *)((byte *)expr + 1);
  goto LAB_00102797;
}

Assistant:

int formula(const char *expr, struct rpf_t **rpf, const struct variables_t *variable)
{
  int i;
  struct stack_t op[256];
  struct stack_t num[256];
  int sp_op, sp_num;
  struct rpf_t rpf_start;
  struct rpf_t *rpf_tmp;
  *rpf = NULL;
  int op_cont;

  sp_num = 0;
  sp_op = 0;
  op_cont = 0;
  for (; *expr; expr++)
  {
    //printf( "[o%d/n%d] %s\n", sp_op, sp_num, expr );
    if (*expr == '(')
    {
      const char *end;
      int rank2;
      struct rpf_t *rpf2;

      rank2 = 0;
      for (; isspace(*expr); expr++)
        ;
      for (end = expr; *end; end++)
      {
        if (*end == '(')
          rank2++;
        if (*end == ')')
          rank2--;
        if (rank2 == 0)
          break;
      }
      if (rank2 || !(*end))
        return 0;
      if (formula(expr + 1, &rpf2, variable) == 0)
        return 0;
      if (rpf2)
      {
        num[sp_num].rank = 0;
        num[sp_num].type = TYPE_RPF;
        num[sp_num].value = rpf2;
        sp_num++;
      }

      expr = end;
      op_cont = 0;
      continue;
    }
    else if (*expr == ')')
    {
      op_cont = 0;
      break;
    }
    else if (*expr == ',')
    {
      if (formula_output(num, &sp_num, op, &sp_op, 0) == NULL)
        return 0;
      op_cont = 0;
      continue;
    }
    else if (isspace(*expr))
    {
      op_cont = 0;
      continue;
    }
    for (i = 0; operation[i].type != TYPE_MAX; i++)
    {
      if (strstr(expr, operation[i].op) == expr)
      {
        if (sp_op > 0 && op[sp_op - 1].rank == operation[i].rank)
        {
          int sp_op2;
          sp_op2 = 1;
          if (formula_output(num, &sp_num, op + sp_op - 1, &sp_op2, operation[i].rank) == NULL)
            return 0;
          sp_op--;
        }
        else if (sp_op > 0 && op[sp_op - 1].rank > operation[i].rank)
        {
          if (formula_output(num, &sp_num, op, &sp_op, operation[i].rank) == NULL)
            return 0;
        }
        expr += strlen(operation[i].op);
        for (; isspace(*expr); expr++)
          ;

        if (sp_num == 0 && operation[i].func == math_sub)
        {
          // Case: start with -
          num[sp_num].rank = 0;
          num[sp_num].type = TYPE_VALUE;
          num[sp_num].value = malloc(sizeof(double));
          *((double *)num[sp_num].value) = -1;
          sp_num++;
          op[sp_op].rank = operation[OPERATION_MUL].rank;
          op[sp_op].type = operation[OPERATION_MUL].type;
          op[sp_op].value = &operation[OPERATION_MUL];
          sp_op++;
          op_cont = 0;
          expr--;
          break;
        }
        else if (op_cont == 1 && operation[i].type != TYPE_MATH)
        {
          if (operation[i].func == math_sub)
          {
            // Case: x*-y
            num[sp_num].rank = 0;
            num[sp_num].type = TYPE_VALUE;
            num[sp_num].value = malloc(sizeof(double));
            *((double *)num[sp_num].value) = -1;
            sp_num++;
            op[sp_op].rank = operation[OPERATION_MUL].rank;
            op[sp_op].type = operation[OPERATION_MUL].type;
            op[sp_op].value = &operation[OPERATION_MUL];
            sp_op++;
            op_cont = 0;
            expr--;
            break;
          }
          else
          {
            // Case: x*/y (Error)
            return 0;
          }
        }

        if (operation[i].type != TYPE_MATH)
        {
          op_cont = 1;
        }
        else
        {
          op[sp_op].rank = operation[i].rank;
          op[sp_op].type = operation[i].type;
          op[sp_op].value = &operation[i];
          sp_op++;
          op_cont = 0;
          if (operation[i].narg > 0)
          {
            const char *end;
            int rank2;
            struct rpf_t *rpf2;

            rank2 = 0;

            for (end = expr; *end; end++)
            {
              if (*end == '(')
                rank2++;
              if (*end == ')')
                rank2--;
              if (rank2 == 0)
                break;
            }
            if (rank2 || !(*end))
              return 0;
            if (formula(expr + 1, &rpf2, variable) == 0)
              return 0;
            if (!rpf2)
              return 0;

            num[sp_num].rank = 0;
            num[sp_num].type = TYPE_RPF;
            num[sp_num].value = rpf2;
            rpf_push(rpf_last(rpf2), &op[sp_op - 1]);
            sp_op--;
            sp_num++;
            expr = end + 1;
          }
        }
        if (operation[i].type != TYPE_MATH)
        {
          op[sp_op].rank = operation[i].rank;
          op[sp_op].type = operation[i].type;
          op[sp_op].value = &operation[i];
          sp_op++;
        }
        expr--;

        break;
      }
    }
    if (operation[i].type != TYPE_MAX)
      continue;
    op_cont = 0;
    if (isalpha(*expr))
    {
      const char *end;
      char variable_name[256];
      int i;

      if (!variable)
        return 0;

      i = 0;
      for (end = expr; *end; end++)
      {
        if (!(isalnum(*end) || *end == '_' || *end == '[' || *end == ']'))
          break;
        variable_name[i++] = *end;
      }
      variable_name[i] = 0;

      for (i = 0; variable[i].name; i++)
      {
        if (strcmp(variable[i].name, variable_name) == 0)
        {
          num[sp_num].rank = 0;
          num[sp_num].type = TYPE_VARIABLE;
          num[sp_num].value = variable[i].pointer;
          sp_num++;
          break;
        }
      }
      if (!variable[i].name)
        return 0;
      expr = end - 1;
    }
    else
    {
      const char *end;

      for (end = expr; *end; end++)
      {
        if (!(isdigit(*end) || (end == expr && *end == '-') || *end == '.'))
          break;
      }
      num[sp_num].rank = 0;
      num[sp_num].type = TYPE_VALUE;
      num[sp_num].value = malloc(sizeof(double));
      *((double *)num[sp_num].value) = strtod(expr, NULL);
      sp_num++;
      expr = end - 1;
    }
  }
  if (formula_output(num, &sp_num, op, &sp_op, 0) == NULL)
    return 0;
  if (sp_num < 0 || sp_op != 0)
    return 0;

  rpf_start.type = TYPE_START;
  rpf_tmp = &rpf_start;
  for (sp_num--; sp_num >= 0; sp_num--)
  {
    switch (num[sp_num].type)
    {
      case TYPE_RPF:
        rpf_tmp = rpf_join(rpf_tmp, num[sp_num].value);
        break;
      default:
        rpf_tmp = rpf_push(rpf_tmp, &num[sp_num]);
        break;
    }
  }
  *rpf = rpf_start.next;
  return 1;
}